

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O1

IterateResult __thiscall
gl4cts::ShaderSubroutine::FunctionalTest7_8::iterate(FunctionalTest7_8 *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  GLuint GVar5;
  GLint GVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  NotSupportedError *this_00;
  char *description;
  char *__filename;
  long lVar7;
  GLuint *pGVar8;
  buffer transform_feedback_buffer;
  vertexArray vao;
  program program;
  
  if (iterate()::uni_left == '\0') {
    iterate();
  }
  if (iterate()::uni_right == '\0') {
    iterate();
  }
  if (iterate()::uni_indices == '\0') {
    iterate();
  }
  bVar1 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_shader_subroutine");
  if (bVar1) {
    transform_feedback_buffer.m_context = (this->super_TestCase).m_context;
    program.m_tesselation_control_shader_id = 0;
    program.m_tesselation_evaluation_shader_id = 0;
    program.m_vertex_shader_id = 0;
    program.m_compute_shader_id = 0;
    program.m_fragment_shader_id = 0;
    program.m_geometry_shader_id = 0;
    program.m_program_object_id = 0;
    transform_feedback_buffer.m_id = 0;
    vao.m_id = 0;
    vao.m_context = transform_feedback_buffer.m_context;
    program.m_context = transform_feedback_buffer.m_context;
    Utils::program::build
              (&program,(GLchar *)0x0,(GLchar *)0x0,(GLchar *)0x0,(GLchar *)0x0,(GLchar *)0x0,
               "#version 400 core\n#extension GL_ARB_shader_subroutine : require\n\nprecision highp float;\n\n// Subroutine type\nsubroutine vec4 routine_type(in vec4 left, in vec4 right);\n\n// Subroutine definitions\nsubroutine(routine_type) vec4 add(in vec4 left, in vec4 right)\n{\n    return left + right;\n}\n\nsubroutine(routine_type) vec4 multiply(in vec4 left, in vec4 right)\n{\n    return left * right;\n}\n\n// Sub routine uniform\nsubroutine uniform routine_type routine[4];\n\n// Input data\nuniform vec4  uni_left;\nuniform vec4  uni_right;\nuniform uvec4 uni_indices;\n\n// Output\nout vec4 out_combined;\nout vec4 out_combined_inverted;\nout vec4 out_constant;\nout vec4 out_constant_inverted;\nout vec4 out_dynamic;\nout vec4 out_dynamic_inverted;\nout vec4 out_loop;\nout uint out_array_length;\n\nvoid main()\n{\n    out_combined          = routine[3](routine[2](routine[1](routine[0](uni_left, uni_right), uni_right), uni_right), uni_right);\n    out_combined_inverted = routine[0](routine[1](routine[2](routine[3](uni_left, uni_right), uni_right), uni_right), uni_right);\n    \n    out_constant          = routine[3](routine[2](routine[1](routine[0](vec4(1, 2, 3, 4), vec4(-5, -6, -7, -8)), vec4(-1, -2, -3, -4)), vec4(5, 6, 7, 8)), vec4(1, 2, 3, 4));\n    out_constant_inverted = routine[0](routine[1](routine[2](routine[3](vec4(1, 2, 3, 4), vec4(-5, -6, -7, -8)), vec4(-1, -2, -3, -4)), vec4(5, 6, 7, 8)), vec4(1, 2, 3, 4));\n    \n    out_dynamic           = routine[uni_indices.w](routine[uni_indices.z](routine[uni_indices.y](routine[uni_indices.x](uni_left, uni_right), uni_right), uni_right), uni_right);\n    out_dynamic_inverted  = routine[uni_indices.x](routine[uni_indices.y](routine[uni_indices.z](routine[uni_indices.w](uni_left, uni_right), uni_right), uni_right), uni_right);\n    \n    out_loop              = uni_left;\n    for (uint i = 0u; i < routine.length(); ++i)\n    {\n        out_loop          = routine[i](out_loop, uni_right);\n    }\n    \n    out_array_length      = routine.length() + 6 - (uni_indices.x + uni_indices.y + uni_indices.z + uni_indices.w);\n}\n\n"
               ,iterate::varying_names,8,false);
    iVar3 = (*(program.m_context)->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var,iVar3) + 0x1680))(program.m_program_object_id);
    dVar4 = (**(code **)(CONCAT44(extraout_var,iVar3) + 0x800))();
    glu::checkError(dVar4,"UseProgram",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x28f);
    Utils::vertexArray::generate(&vao);
    iVar3 = (*(vao.m_context)->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_00,iVar3) + 0xd8))(vao.m_id);
    dVar4 = (**(code **)(CONCAT44(extraout_var_00,iVar3) + 0x800))();
    glu::checkError(dVar4,"BindVertexArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x309);
    Utils::buffer::generate(&transform_feedback_buffer);
    pGVar8 = this->m_subroutine_indices;
    lVar7 = 0;
    do {
      GVar5 = Utils::program::getSubroutineIndex
                        (&program,*(GLchar **)((long)iterate::subroutine_names + lVar7),0x8b31);
      *pGVar8 = GVar5;
      lVar7 = lVar7 + 8;
      pGVar8 = pGVar8 + 1;
    } while (lVar7 == 8);
    lVar7 = 0;
    do {
      GVar6 = Utils::program::getSubroutineUniformLocation
                        (&program,(GLchar *)
                                  ((long)&
                                         _ZZN6gl4cts16ShaderSubroutine17FunctionalTest7_87iterateEvE24subroutine_uniform_names_rel
                                  + (long)*(int *)((long)&
                                                  _ZZN6gl4cts16ShaderSubroutine17FunctionalTest7_87iterateEvE24subroutine_uniform_names_rel
                                                  + lVar7)),0x8b31);
      *(GLint *)((long)this->m_subroutine_uniform_locations + lVar7) = GVar6;
      lVar7 = lVar7 + 4;
    } while (lVar7 != 0x10);
    lVar7 = 0;
    do {
      GVar6 = Utils::program::getUniformLocation
                        (&program,(GLchar *)
                                  ((long)&
                                         _ZZN6gl4cts16ShaderSubroutine17FunctionalTest7_87iterateEvE13uniform_names_rel
                                  + (long)*(int *)((long)&
                                                  _ZZN6gl4cts16ShaderSubroutine17FunctionalTest7_87iterateEvE13uniform_names_rel
                                                  + lVar7)));
      *(GLint *)((long)this->m_uniform_locations + lVar7) = GVar6;
      lVar7 = lVar7 + 4;
    } while (lVar7 != 0xc);
    bVar1 = true;
    lVar7 = 0;
    do {
      Utils::buffer::update(&transform_feedback_buffer,0x8c8e,0x80,(GLvoid *)0x0,0x88ea);
      iVar3 = (*(transform_feedback_buffer.m_context)->m_renderCtx->_vptr_RenderContext[3])();
      (**(code **)(CONCAT44(extraout_var_01,iVar3) + 0x50))
                (0x8c8e,0,transform_feedback_buffer.m_id,0,0x80);
      dVar4 = (**(code **)(CONCAT44(extraout_var_01,iVar3) + 0x800))();
      glu::checkError(dVar4,"BindBufferRange",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x4e);
      bVar2 = testDraw(this,(GLuint *)((long)iterate::subroutine_combinations[0] + lVar7),
                       &iterate::uni_left,&iterate::uni_right,&iterate::uni_indices);
      if (!bVar2) {
        bVar1 = false;
      }
      lVar7 = lVar7 + 0x10;
    } while (lVar7 != 0x100);
    __filename = (char *)(ulong)(uint)(byte)~bVar1;
    description = "Fail";
    if (bVar1) {
      description = "Pass";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)(byte)~bVar1,
               description);
    Utils::vertexArray::~vertexArray(&vao);
    Utils::buffer::~buffer(&transform_feedback_buffer);
    Utils::program::remove(&program,__filename);
    return STOP;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  program._0_8_ = &program.m_tesselation_control_shader_id;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&program,"GL_ARB_shader_subroutine is not supported.","");
  tcu::NotSupportedError::NotSupportedError(this_00,(string *)&program);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult FunctionalTest7_8::iterate()
{
	static const GLchar* vertex_shader_code =
		"#version 400 core\n"
		"#extension GL_ARB_shader_subroutine : require\n"
		"\n"
		"precision highp float;\n"
		"\n"
		"// Subroutine type\n"
		"subroutine vec4 routine_type(in vec4 left, in vec4 right);\n"
		"\n"
		"// Subroutine definitions\n"
		"subroutine(routine_type) vec4 add(in vec4 left, in vec4 right)\n"
		"{\n"
		"    return left + right;\n"
		"}\n"
		"\n"
		"subroutine(routine_type) vec4 multiply(in vec4 left, in vec4 right)\n"
		"{\n"
		"    return left * right;\n"
		"}\n"
		"\n"
		"// Sub routine uniform\n"
		"subroutine uniform routine_type routine[4];\n"
		"\n"
		"// Input data\n"
		"uniform vec4  uni_left;\n"
		"uniform vec4  uni_right;\n"
		"uniform uvec4 uni_indices;\n"
		"\n"
		"// Output\n"
		"out vec4 out_combined;\n"
		"out vec4 out_combined_inverted;\n"
		"out vec4 out_constant;\n"
		"out vec4 out_constant_inverted;\n"
		"out vec4 out_dynamic;\n"
		"out vec4 out_dynamic_inverted;\n"
		"out vec4 out_loop;\n"
		"out uint out_array_length;\n"
		"\n"
		"void main()\n"
		"{\n"
		"    out_combined          = routine[3](routine[2](routine[1](routine[0](uni_left, uni_right), uni_right), "
		"uni_right), uni_right);\n"
		"    out_combined_inverted = routine[0](routine[1](routine[2](routine[3](uni_left, uni_right), uni_right), "
		"uni_right), uni_right);\n"
		"    \n"
		"    out_constant          = routine[3](routine[2](routine[1](routine[0](vec4(1, 2, 3, 4), vec4(-5, -6, -7, "
		"-8)), vec4(-1, -2, -3, -4)), vec4(5, 6, 7, 8)), vec4(1, 2, 3, 4));\n"
		"    out_constant_inverted = routine[0](routine[1](routine[2](routine[3](vec4(1, 2, 3, 4), vec4(-5, -6, -7, "
		"-8)), vec4(-1, -2, -3, -4)), vec4(5, 6, 7, 8)), vec4(1, 2, 3, 4));\n"
		"    \n"
		"    out_dynamic           = "
		"routine[uni_indices.w](routine[uni_indices.z](routine[uni_indices.y](routine[uni_indices.x](uni_left, "
		"uni_right), uni_right), uni_right), uni_right);\n"
		"    out_dynamic_inverted  = "
		"routine[uni_indices.x](routine[uni_indices.y](routine[uni_indices.z](routine[uni_indices.w](uni_left, "
		"uni_right), uni_right), uni_right), uni_right);\n"
		"    \n"
		"    out_loop              = uni_left;\n"
		"    for (uint i = 0u; i < routine.length(); ++i)\n"
		"    {\n"
		"        out_loop          = routine[i](out_loop, uni_right);\n"
		"    }\n"
		"    \n"
		"    out_array_length      = routine.length() + 6 - (uni_indices.x + uni_indices.y + uni_indices.z + "
		"uni_indices.w);\n"
		"}\n"
		"\n";

	static const GLchar* subroutine_names[] = {
		"add", "multiply",
	};
	static const GLuint n_subroutine_names = sizeof(subroutine_names) / sizeof(subroutine_names[0]);

	static const GLchar* subroutine_uniform_names[] = { "routine[0]", "routine[1]", "routine[2]", "routine[3]" };
	static const GLuint  n_subroutine_uniform_names =
		sizeof(subroutine_uniform_names) / sizeof(subroutine_uniform_names[0]);

	static const GLchar* uniform_names[] = {
		"uni_left", "uni_right", "uni_indices",
	};
	static const GLuint n_uniform_names = sizeof(uniform_names) / sizeof(uniform_names[0]);

	static const GLchar* varying_names[] = { "out_combined", "out_combined_inverted",
											 "out_constant", "out_constant_inverted",
											 "out_dynamic",  "out_dynamic_inverted",
											 "out_loop",	 "out_array_length" };

	static const GLuint n_varyings					   = sizeof(varying_names) / sizeof(varying_names[0]);
	static const GLuint transform_feedback_buffer_size = n_varyings * 4 * sizeof(GLfloat);

	/* Test data */
	static const Utils::vec4<GLfloat> uni_left(-1.0f, 0.75f, -0.5f, 0.25f);
	static const Utils::vec4<GLfloat> uni_right(1.0f, -0.75f, 0.5f, -0.25f);
	static const Utils::vec4<GLuint>  uni_indices(1, 2, 0, 3);

	static const GLuint subroutine_combinations[][4] = {
		{ 0, 0, 0, 0 }, /* + + + + */
		{ 0, 0, 0, 1 }, /* + + + * */
		{ 0, 0, 1, 0 }, /* + + * + */
		{ 0, 0, 1, 1 }, /* + + * * */
		{ 0, 1, 0, 0 }, /* + * + + */
		{ 0, 1, 0, 1 }, /* + * + * */
		{ 0, 1, 1, 0 }, /* + * * + */
		{ 0, 1, 1, 1 }, /* + * * * */
		{ 1, 0, 0, 0 }, /* * + + + */
		{ 1, 0, 0, 1 }, /* * + + * */
		{ 1, 0, 1, 0 }, /* * + * + */
		{ 1, 0, 1, 1 }, /* * + * * */
		{ 1, 1, 0, 0 }, /* * * + + */
		{ 1, 1, 0, 1 }, /* * * + * */
		{ 1, 1, 1, 0 }, /* * * * + */
		{ 1, 1, 1, 1 }  /* * * * * */
	};
	static const GLuint n_subroutine_combinations =
		sizeof(subroutine_combinations) / sizeof(subroutine_combinations[0]);

	/* Do not execute the test if GL_ARB_shader_subroutine is not supported */
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_shader_subroutine"))
	{
		throw tcu::NotSupportedError("GL_ARB_shader_subroutine is not supported.");
	}

	/* GL objects */
	Utils::program	 program(m_context);
	Utils::buffer	  transform_feedback_buffer(m_context);
	Utils::vertexArray vao(m_context);

	bool result = true;

	/* Init GL objects */
	program.build(0 /* cs */, 0 /* fs */, 0 /* gs */, 0 /* tcs */, 0 /* test */, vertex_shader_code, varying_names,
				  n_varyings);

	program.use();

	vao.generate();
	vao.bind();

	transform_feedback_buffer.generate();

	/* Get subroutine indices */
	for (GLuint routine = 0; routine < n_subroutine_names; ++routine)
	{
		m_subroutine_indices[routine] = program.getSubroutineIndex(subroutine_names[routine], GL_VERTEX_SHADER);
	}

	/* Get subroutine uniform locations */
	for (GLuint uniform = 0; uniform < n_subroutine_uniform_names; ++uniform)
	{
		m_subroutine_uniform_locations[uniform] =
			program.getSubroutineUniformLocation(subroutine_uniform_names[uniform], GL_VERTEX_SHADER);
	}

	/* Get uniform locations */
	for (GLuint i = 0; i < n_uniform_names; ++i)
	{
		m_uniform_locations[i] = program.getUniformLocation(uniform_names[i]);
	}

	/* Test */
	for (GLuint i = 0; i < n_subroutine_combinations; ++i)
	{
		/* Clean */
		transform_feedback_buffer.update(GL_TRANSFORM_FEEDBACK_BUFFER, transform_feedback_buffer_size, 0 /* data */,
										 GL_DYNAMIC_COPY);
		transform_feedback_buffer.bindRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, 0, transform_feedback_buffer_size);

		/* Verify */
		if (false == testDraw(subroutine_combinations[i], uni_left, uni_right, uni_indices))
		{
			result = false;
		}
	}

	if (true == result)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return tcu::TestNode::STOP;
}